

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool set_voice_path(OpenJTalk *oj,char *path)

{
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  char temp [260];
  char acStack_128 [264];
  
  if (path == (char *)0x0 || oj == (OpenJTalk *)0x0) {
    return false;
  }
  if (*path != '\0') {
    memset(acStack_128,0,0x104);
    _Var1 = is_relative(path);
    if (_Var1) {
      sVar2 = strlen(oj->dn_voice_dir_path);
      if (sVar2 == 0) {
        return false;
      }
      sVar3 = strlen(path);
      if ((sVar3 + sVar2) - 0x103 < 0xfffffffffffffefb) {
        return false;
      }
      strcpy(acStack_128,oj->dn_voice_dir_path);
      strcat(acStack_128,G_SLASH_CHAR);
      strcat(acStack_128,path);
    }
    else {
      strcpy(acStack_128,path);
    }
    _Var1 = exists_file(acStack_128);
    if (_Var1) {
      strcpy(oj->fn_voice_path,acStack_128);
      Open_JTalk_load_voice(oj->open_jtalk,acStack_128);
      return true;
    }
  }
  return false;
}

Assistant:

bool set_voice_path(OpenJTalk *oj, const char *path)
{
	if (!oj)
	{
		return false;
	}

	if (path == NULL || strlen(path) == 0)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	// 相対指定の場合、
	if (is_relative(path))
	{
		if (oj->dn_voice_dir_path != NULL && strlen(oj->dn_voice_dir_path) != 0)
		{
			if (strlen(oj->dn_voice_dir_path) + 1 + strlen(path) + 1 > MAX_PATH)
			{
				return false;
			}

			strcpy(temp, oj->dn_voice_dir_path);
			strcat(temp, G_SLASH_CHAR);
			strcat(temp, path);

			if (exists_file(temp))
			{
				goto return_true;
			}
		}
	}

	// 絶対指定の場合、
	else
	{
		strcpy(temp, path);
		if (exists_file(temp))
		{
			goto return_true;
		}
	}

	return false;

return_true:
	strcpy(oj->fn_voice_path, temp);
#if defined(_WIN32)
	char temp2[MAX_PATH];
	clear_path_string(temp2, MAX_PATH);
	u8tosjis_path(temp, temp2);
	Open_JTalk_load_voice(oj->open_jtalk, temp2);
#else
	Open_JTalk_load_voice(oj->open_jtalk, temp);
#endif
	return true;
}